

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# define_conversion.cpp
# Opt level: O0

void skiwi::define_conversion(Program *prog)

{
  anon_class_24_3_59193a20_for_pred pred;
  bool bVar1;
  allocator<char> local_89;
  string local_88;
  undefined1 *local_58;
  undefined1 *puStack_50;
  string *local_48;
  undefined1 local_40 [8];
  string filename;
  int column_nr;
  int line_nr;
  define_conversion_visitor dcv;
  Program *prog_local;
  
  dcv.super_base_visitor<skiwi::(anonymous_namespace)::define_conversion_visitor>._vptr_base_visitor
       = (base_visitor<skiwi::(anonymous_namespace)::define_conversion_visitor>)
         (base_visitor<skiwi::(anonymous_namespace)::define_conversion_visitor>)prog;
  if (((prog->simplified_to_core_forms ^ 0xffU) & 1) == 0) {
    __assert_fail("!prog.simplified_to_core_forms",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/define_conversion.cpp"
                  ,0xd4,"void skiwi::define_conversion(Program &)");
  }
  if (((prog->closure_converted ^ 0xffU) & 1) != 0) {
    remove_nested_begin_expressions(prog);
    anon_unknown_26::define_conversion_visitor::define_conversion_visitor
              ((define_conversion_visitor *)&column_nr);
    visitor<skiwi::Program,_skiwi::(anonymous_namespace)::define_conversion_visitor>::visit
              ((Program *)
               dcv.super_base_visitor<skiwi::(anonymous_namespace)::define_conversion_visitor>.
               _vptr_base_visitor,(define_conversion_visitor *)&column_nr);
    *(undefined1 *)
     ((long)dcv.super_base_visitor<skiwi::(anonymous_namespace)::define_conversion_visitor>.
            _vptr_base_visitor + 0x4a) = 1;
    std::__cxx11::string::string((string *)local_40);
    local_58 = (undefined1 *)((long)&filename.field_2 + 0xc);
    puStack_50 = (undefined1 *)((long)&filename.field_2 + 8);
    pred.column_nr = (int *)puStack_50;
    pred.line_nr = (int *)local_58;
    pred.filename = (string *)local_40;
    local_48 = (string *)local_40;
    bVar1 = find<skiwi::define_conversion(skiwi::Program&)::__0>
                      ((Program *)
                       dcv.
                       super_base_visitor<skiwi::(anonymous_namespace)::define_conversion_visitor>.
                       _vptr_base_visitor,pred);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
      throw_error(filename.field_2._12_4_,filename.field_2._8_4_,(string *)local_40,
                  define_invalid_place,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
    }
    std::__cxx11::string::~string((string *)local_40);
    return;
  }
  __assert_fail("!prog.closure_converted",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/define_conversion.cpp"
                ,0xd5,"void skiwi::define_conversion(Program &)");
}

Assistant:

void define_conversion(Program& prog)
  {
  assert(!prog.simplified_to_core_forms);
  assert(!prog.closure_converted);
  remove_nested_begin_expressions(prog);  
  define_conversion_visitor dcv;
  visitor<Program, define_conversion_visitor>::visit(prog, &dcv);
  prog.define_converted = true;

  int line_nr, column_nr;
  std::string filename;
  if (find(prog, [&](const Expression& e) {if (std::holds_alternative<PrimitiveCall>(e) && std::get<PrimitiveCall>(e).primitive_name == "define")
    {
    line_nr = std::get<PrimitiveCall>(e).line_nr;
    column_nr = std::get<PrimitiveCall>(e).column_nr;
    filename = std::get<PrimitiveCall>(e).filename;
    return true;
    }
  else return false; }))
    {
    throw_error(line_nr, column_nr, filename, define_invalid_place);
    }

  }